

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

void test_send_impl(char *file,int line,int sock,char *data)

{
  FILE *__stream;
  uint uVar1;
  uint *puVar2;
  char *pcVar3;
  
  uVar1 = nn_send(line,"ABC",3,0);
  __stream = _stderr;
  if ((int)uVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    pcVar3 = nn_err_strerror(*puVar2);
    fprintf(__stream,"Failed to send: %s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/bug328.c"
            ,(ulong)file & 0xffffffff);
    nn_err_abort();
  }
  if (uVar1 == 3) {
    return;
  }
  fprintf(_stderr,"Data to send is truncated: %d != %d (%s:%d)\n",(ulong)uVar1,3,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/bug328.c",
          (ulong)file & 0xffffffff);
  nn_err_abort();
}

Assistant:

static void NN_UNUSED test_send_impl (char *file, int line,
    int sock, char *data)
{
    size_t data_len;
    int rc;

    data_len = strlen (data);

    rc = nn_send (sock, data, data_len, 0);
    if (rc < 0) {
        fprintf (stderr, "Failed to send: %s [%d] (%s:%d)\n",
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
    if (rc != (int)data_len) {
        fprintf (stderr, "Data to send is truncated: %d != %d (%s:%d)\n",
            rc, (int) data_len,
            file, line);
        nn_err_abort ();
    }
}